

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O1

long __thiscall FileReaderLZSS::Read(FileReaderLZSS *this,void *buffer,long len)

{
  BYTE *__dest;
  BYTE **ppBVar1;
  uint *puVar2;
  StreamState SVar3;
  uint uVar4;
  ulong __n;
  void *__dest_00;
  
  __dest = (this->Stream).Window;
  __dest_00 = buffer;
LAB_004d61a7:
  do {
    if ((this->Stream).AvailIn != 0) {
      SVar3 = (this->Stream).State;
      if (SVar3 == STREAM_EMPTY) {
        PrepareBlocks(this);
        goto LAB_004d61a7;
      }
      if (SVar3 == STREAM_BITS) {
        UncompressBlock(this);
      }
    }
    uVar4 = (this->Stream).InternalOut;
    if ((uint)len <= uVar4) {
      uVar4 = (uint)len;
    }
    if (uVar4 != 0) {
      __n = (ulong)uVar4;
      memcpy(__dest_00,(this->Stream).WindowData,__n);
      __dest_00 = (void *)((long)__dest_00 + __n);
      len = len - __n;
      memmove(__dest,__dest + __n,(ulong)(0x1080 - uVar4));
      ppBVar1 = &(this->Stream).InternalBuffer;
      *ppBVar1 = *ppBVar1 + -__n;
      puVar2 = &(this->Stream).InternalOut;
      *puVar2 = *puVar2 - uVar4;
    }
    SVar3 = (this->Stream).State;
    if (SVar3 != STREAM_FINAL) {
      if ((SVar3 == STREAM_FLUSH) && ((this->Stream).InternalOut == 0)) {
        (this->Stream).State = STREAM_EMPTY;
      }
      if ((this->Stream).AvailIn < 2) {
        FillBuffer(this);
      }
    }
    if (((SVar3 == STREAM_FINAL) || (len == 0)) || ((this->Stream).State == STREAM_FINAL)) {
      if (len == 0) {
        return (long)__dest_00 - (long)buffer;
      }
      __assert_fail("AvailOut == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/file_wad.cpp"
                    ,0xe0,"virtual long FileReaderLZSS::Read(void *, long)");
    }
  } while( true );
}

Assistant:

long Read(void *buffer, long len)
	{

		BYTE *Out = (BYTE*)buffer;
		long AvailOut = len;

		do
		{
			while(Stream.AvailIn)
			{
				if(Stream.State == STREAM_EMPTY)
					PrepareBlocks();
				else if(Stream.State == STREAM_BITS && !UncompressBlock())
					break;
				else
					break;
			}

			unsigned int copy = MIN<unsigned int>(Stream.InternalOut, AvailOut);
			if(copy > 0)
			{
				memcpy(Out, Stream.WindowData, copy);
				Out += copy;
				AvailOut -= copy;

				// Slide our window
				memmove(Stream.Window, Stream.Window+copy, WINDOW_SIZE+INTERNAL_BUFFER_SIZE-copy);
				Stream.InternalBuffer -= copy;
				Stream.InternalOut -= copy;
			}

			if(Stream.State == STREAM_FINAL)
				break;

			if(Stream.InternalOut == 0 && Stream.State == STREAM_FLUSH)
				Stream.State = STREAM_EMPTY;

			if(Stream.AvailIn < 2)
				FillBuffer();
		}
		while(AvailOut && Stream.State != STREAM_FINAL);

		assert(AvailOut == 0);
		return (long)(Out - (BYTE*)buffer);
	}